

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void rehash(ecs_map_t *map,int32_t bucket_count)

{
  ulong uVar1;
  ecs_bucket_t *bucket;
  ecs_size_t elem_size;
  ecs_bucket_t *peVar2;
  ecs_map_key_t *peVar3;
  void *pvVar4;
  ecs_map_key_t key;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int index;
  ulong uVar8;
  
  _ecs_assert(bucket_count != 0,0xc,(char *)0x0,"bucket_count != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0xc1);
  if (bucket_count == 0) {
    __assert_fail("bucket_count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0xc1,"void rehash(ecs_map_t *, int32_t)");
  }
  _ecs_assert(map->bucket_count < bucket_count,0xc,(char *)0x0,"bucket_count > map->bucket_count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0xc2);
  if (map->bucket_count < bucket_count) {
    elem_size = map->elem_size;
    ensure_buckets(map,bucket_count);
    peVar2 = map->buckets;
    _ecs_assert(peVar2 != (ecs_bucket_t *)0x0,0xc,(char *)0x0,"buckets != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0xc9);
    if (peVar2 != (ecs_bucket_t *)0x0) {
      if (0 < bucket_count) {
        uVar8 = (ulong)(uint)bucket_count;
        do {
          uVar1 = uVar8 - 1;
          bucket = peVar2 + uVar1;
          iVar7 = bucket->count;
          if (0 < iVar7) {
            peVar3 = peVar2[uVar1].keys;
            pvVar4 = bucket->payload;
            index = 0;
            do {
              key = peVar3[index];
              uVar6 = get_bucket_id(bucket_count,key);
              if (uVar1 != uVar6) {
                add_to_bucket(peVar2 + uVar6,elem_size,key,
                              (void *)((long)(index * elem_size) + (long)pvVar4));
                remove_from_bucket(bucket,elem_size,key,index);
                iVar7 = iVar7 + -1;
                index = index + -1;
              }
              index = index + 1;
            } while (index < iVar7);
            iVar7 = bucket->count;
          }
          if (iVar7 == 0) {
            (*ecs_os_api.free_)(bucket->keys);
            (*ecs_os_api.free_)(bucket->payload);
            bucket->keys = (ecs_map_key_t *)0x0;
            bucket->payload = (void *)0x0;
            bucket->count = 0;
          }
          bVar5 = 1 < (long)uVar8;
          uVar8 = uVar1;
        } while (bVar5);
      }
      return;
    }
    __assert_fail("buckets != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0xc9,"void rehash(ecs_map_t *, int32_t)");
  }
  __assert_fail("bucket_count > map->bucket_count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0xc2,"void rehash(ecs_map_t *, int32_t)");
}

Assistant:

static
void rehash(
    ecs_map_t *map,
    int32_t bucket_count)
{
    ecs_assert(bucket_count != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(bucket_count > map->bucket_count, ECS_INTERNAL_ERROR, NULL);

    ecs_size_t elem_size = map->elem_size;

    ensure_buckets(map, bucket_count);

    ecs_bucket_t *buckets = map->buckets;
    ecs_assert(buckets != NULL, ECS_INTERNAL_ERROR, NULL);
    
    int32_t bucket_id;

    /* Iterate backwards as elements could otherwise be moved to existing
        * buckets which could temporarily cause the number of elements in a
        * bucket to exceed BUCKET_COUNT. */
    for (bucket_id = bucket_count - 1; bucket_id >= 0; bucket_id --) {
        ecs_bucket_t *bucket = &buckets[bucket_id];

        int i, count = bucket->count;
        ecs_map_key_t *key_array = bucket->keys;
        void *payload_array = bucket->payload;

        for (i = 0; i < count; i ++) {
            ecs_map_key_t key = key_array[i];
            void *elem = GET_ELEM(payload_array, elem_size, i);
            int32_t new_bucket_id = get_bucket_id(bucket_count, key);

            if (new_bucket_id != bucket_id) {
                ecs_bucket_t *new_bucket = &buckets[new_bucket_id];

                add_to_bucket(new_bucket, elem_size, key, elem);
                remove_from_bucket(bucket, elem_size, key, i);

                count --;
                i --;
            }
        }

        if (!bucket->count) {
            clear_bucket(bucket);
        }
    }
}